

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall PhyloTree::PhyloTree(PhyloTree *this,string *t,bool rooted)

{
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *pdVar1;
  bool bVar2;
  difference_type dVar3;
  difference_type dVar4;
  invalid_argument *this_00;
  ulong uVar5;
  string *psVar6;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *pdVar7;
  char *pcVar8;
  reference pvVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  reference this_01;
  difference_type dVar13;
  Bipartition *pBVar14;
  out_of_range *this_02;
  reference pvVar15;
  size_type sVar16;
  byte in_DL;
  string *in_RSI;
  char cVar17;
  string *in_RDI;
  PhyloTreeEdge *this_03;
  double dVar18;
  double dVar19;
  reference rVar20;
  size_t k;
  out_of_range *range_err;
  PhyloTreeEdge *e;
  iterator __end4;
  iterator __begin4;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range4;
  size_t index;
  size_t lastLeaf;
  size_t alt_end_of_label;
  size_t end_of_length;
  size_t end_of_label;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
  hashmap;
  size_t i;
  string length;
  string label;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> q;
  int leafNum;
  _Self *in_stack_fffffffffffffa88;
  _Self *in_stack_fffffffffffffa90;
  value_type *in_stack_fffffffffffffa98;
  Bipartition *in_stack_fffffffffffffaa0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaa8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffab0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffab8;
  string *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffad8;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffb18;
  PhyloTree *in_stack_fffffffffffffb20;
  size_type local_3a8;
  _Deque_iterator<PhyloTreeEdge,_PhyloTreeEdge_&,_PhyloTreeEdge_*> local_370;
  undefined1 *local_350;
  undefined1 local_341;
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  size_type local_260;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_true>
  local_258;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_true>
  local_250;
  reference local_248;
  string local_238 [32];
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  size_type local_1d0;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_1a8;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_1a0;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_198;
  string local_158 [32];
  string local_138 [32];
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_118;
  string local_110 [32];
  string local_f0;
  undefined1 local_d0 [80];
  int local_80;
  undefined1 local_79;
  string local_78 [39];
  undefined1 local_51;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  std::__cxx11::string::string(in_RDI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16b9c3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16b9dc);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x16b9f5);
  local_20 = std::__cxx11::string::begin();
  local_28 = std::__cxx11::string::end();
  local_29 = 0x28;
  dVar3 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )in_stack_fffffffffffffab0._M_current,in_stack_fffffffffffffaa8,
                     (char *)in_stack_fffffffffffffaa0);
  local_48 = std::__cxx11::string::begin();
  local_50 = std::__cxx11::string::end();
  local_51 = 0x29;
  dVar4 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )in_stack_fffffffffffffab0._M_current,in_stack_fffffffffffffaa8,
                     (char *)in_stack_fffffffffffffaa0);
  if (dVar3 != dVar4) {
    local_79 = 1;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((char *)in_stack_fffffffffffffad8._M_current,in_stack_fffffffffffffad0);
    std::invalid_argument::invalid_argument(this_00,local_78);
    local_79 = 0;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_80 = 0;
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::deque
            ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16bbbd);
  std::__cxx11::string::string((string *)&local_f0);
  std::__cxx11::string::string(local_110);
  local_118 = (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x0;
  cVar17 = (char)in_RSI;
  std::__cxx11::string::find_first_of(cVar17,0x28);
  std::__cxx11::string::substr((ulong)local_138,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_138);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  Tools::despace(in_stack_fffffffffffffad0);
  setLeaf2NumMapFromNewick(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::__cxx11::string::find_first_of(cVar17,0x28);
  std::__cxx11::string::substr((ulong)local_158,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_158);
  std::__cxx11::string::~string(local_158);
  uVar5 = std::__cxx11::string::find_last_of(cVar17,0x29);
  psVar6 = (string *)std::__cxx11::string::erase((ulong)in_RSI,uVar5);
  std::__cxx11::string::operator=(in_RSI,psVar6);
  std::
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                   *)0x16bd4e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RDI + 0x38));
  std::allocator<double>::allocator((allocator<double> *)0x16bd7c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0._M_current,
             (size_type)in_stack_fffffffffffffaa8._M_current,
             (allocator_type *)in_stack_fffffffffffffaa0);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa98);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0);
  std::allocator<double>::~allocator((allocator<double> *)0x16bdce);
  local_1d0 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x38));
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          pdVar1 = local_118;
          pdVar7 = (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   std::__cxx11::string::size();
          if (pdVar7 <= pdVar1) {
            local_3a8 = 0;
            while( true ) {
              sVar10 = local_3a8;
              sVar16 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                  (in_RDI + 0x20));
              if (sVar16 <= sVar10) break;
              this_03 = (PhyloTreeEdge *)(in_RDI + 0x20);
              pvVar12 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                                  ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this_03,
                                   local_3a8);
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this_03,local_3a8)
              ;
              PhyloTreeEdge::asSplit(this_03);
              std::make_shared<Bipartition,Bipartition>
                        ((Bipartition *)in_stack_fffffffffffffab8._M_current);
              PhyloTreeEdge::setOriginalEdge(pvVar12,(shared_ptr<Bipartition> *)this_03);
              std::shared_ptr<Bipartition>::~shared_ptr((shared_ptr<Bipartition> *)0x16c9cf);
              Bipartition::~Bipartition((Bipartition *)0x16c9dc);
              pvVar12 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                                  ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                   (in_RDI + 0x20),local_3a8);
              PhyloTreeEdge::setOriginalID(pvVar12,(int)local_3a8);
              local_3a8 = local_3a8 + 1;
            }
            std::
            unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
            ::~unordered_map((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                              *)0x16ca8d);
            std::__cxx11::string::~string(local_110);
            std::__cxx11::string::~string((string *)&local_f0);
            std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~deque
                      (in_stack_fffffffffffffae0);
            return;
          }
          pcVar8 = (char *)std::__cxx11::string::at((ulong)in_RSI);
          cVar17 = *pcVar8;
          if (cVar17 != '(') break;
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RDI + 0x38));
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f0,sVar10,'0',&local_1f1);
          std::deque<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_front<std::__cxx11::string>
                    ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffa90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa88);
          std::__cxx11::string::~string(local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
          local_118 = (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                      ((long)&(local_118->
                              super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                              _M_impl.super__Deque_impl_data._M_map + 1);
        }
        if (cVar17 != ')') break;
        local_1a0 = (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                    Tools::nextIndex((string *)in_stack_fffffffffffffaa0,
                                     (size_t)in_stack_fffffffffffffa98,
                                     (char *)in_stack_fffffffffffffa90);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        if (*pcVar8 == ':') {
          std::__cxx11::string::string(local_238,in_RSI);
          Tools::substring(in_stack_fffffffffffffad8._M_current,(size_t)in_stack_fffffffffffffad0,
                           (size_t)in_stack_fffffffffffffac8);
          std::__cxx11::string::operator=(local_110,local_218);
          std::__cxx11::string::~string(local_218);
          std::__cxx11::string::~string(local_238);
        }
        else {
          std::__cxx11::string::operator=(local_110,'\0');
        }
        pvVar9 = std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                           ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                            in_stack_fffffffffffffaa0);
        dVar18 = std::__cxx11::stod((string *)in_stack_fffffffffffffa90,
                                    (size_t *)in_stack_fffffffffffffa88);
        PhyloTreeEdge::setAttribute(pvVar9,dVar18);
        if ((local_11 & 1) == 0) {
          std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                    ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffaa0);
          rVar20 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
          local_248 = rVar20;
          bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_248);
          if (bVar2) {
            std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                      ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                       in_stack_fffffffffffffaa0);
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::flip
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffaa0);
          }
          std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                    ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffaa0);
          local_250._M_cur =
               (__node_type *)
               std::
               unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
               ::find((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffa88,(key_type *)0x16c1db);
          local_258._M_cur =
               (__node_type *)
               std::
               unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
               ::end((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                      *)in_stack_fffffffffffffa88);
          bVar2 = std::__detail::operator==(&local_250,&local_258);
          if (bVar2) {
            sVar10 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                               ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                (in_RDI + 0x20));
            std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                      ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                       in_stack_fffffffffffffaa0);
            pmVar11 = std::
                      unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                      ::operator[]((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                                    *)in_stack_fffffffffffffa90,
                                   (key_type *)in_stack_fffffffffffffa88);
            *pmVar11 = sVar10;
            std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                      ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                       in_stack_fffffffffffffaa0);
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                       in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          }
          else {
            std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                      ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                       in_stack_fffffffffffffaa0);
            pmVar11 = std::
                      unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                      ::operator[]((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
                                    *)in_stack_fffffffffffffa90,
                                   (key_type *)in_stack_fffffffffffffa88);
            local_260 = *pmVar11;
            pvVar12 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 (in_RDI + 0x20),local_260);
            pvVar9 = std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                               ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                in_stack_fffffffffffffaa0);
            dVar18 = pvVar9->length;
            this_01 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 (in_RDI + 0x20),local_260);
            dVar19 = PhyloTreeEdge::getLength(this_01);
            PhyloTreeEdge::setAttribute(pvVar12,dVar18 + dVar19);
          }
        }
        else {
          std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                    ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffaa0);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                    ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        }
        std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::pop_front
                  ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffa90
                  );
        local_118 = local_1a0;
      }
      if (cVar17 != ',') break;
      local_118 = (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                  ((long)&(local_118->
                          super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
                          super__Deque_impl_data._M_map + 1);
    }
    local_198 = (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                Tools::nextIndex((string *)in_stack_fffffffffffffaa0,
                                 (size_t)in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90
                                );
    local_1a8 = (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                Tools::nextIndex((string *)in_stack_fffffffffffffaa0,
                                 (size_t)in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90
                                );
    if (local_1a8 < local_198) {
      local_1a0 = local_1a8;
      local_198 = local_1a8;
      std::__cxx11::string::operator=(local_110,'\0');
    }
    else {
      in_stack_fffffffffffffae0 =
           (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
           Tools::nextIndex((string *)in_stack_fffffffffffffaa0,(size_t)in_stack_fffffffffffffa98,
                            (char *)in_stack_fffffffffffffa90);
      local_1a0 = in_stack_fffffffffffffae0;
      std::__cxx11::string::string(local_2a0,in_RSI);
      Tools::substring(in_stack_fffffffffffffad8._M_current,(size_t)in_stack_fffffffffffffad0,
                       (size_t)in_stack_fffffffffffffac8);
      std::__cxx11::string::operator=(local_110,local_280);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_2a0);
    }
    std::__cxx11::string::string(local_2e0,in_RSI);
    Tools::substring(in_stack_fffffffffffffad8._M_current,(size_t)in_stack_fffffffffffffad0,
                     (size_t)in_stack_fffffffffffffac8);
    in_stack_fffffffffffffad0 = &local_f0;
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffffad0,local_2c0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2e0);
    in_stack_fffffffffffffac8 = in_RDI + 0x38;
    local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa88);
    local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffa88);
    in_stack_fffffffffffffad8 =
         std::
         lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                   (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffaa8._M_current);
    local_2e8 = in_stack_fffffffffffffad8._M_current;
    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa88);
    dVar13 = __gnu_cxx::operator-
                       ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffa90,
                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffa88);
    local_80 = (int)dVar13;
    in_stack_fffffffffffffab8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_80;
    pBVar14 = (Bipartition *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x38));
    if ((Bipartition *)in_stack_fffffffffffffab8._M_current == pBVar14) break;
    in_stack_fffffffffffffaa0 =
         (Bipartition *)
         std::__cxx11::stod((string *)in_stack_fffffffffffffa90,(size_t *)in_stack_fffffffffffffa88)
    ;
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_80);
    *pvVar15 = (value_type)in_stack_fffffffffffffaa0;
    local_350 = local_d0;
    std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
              ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffa88);
    std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
              ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffa88);
    while( true ) {
      bVar2 = std::operator!=(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      if (!bVar2) break;
      std::_Deque_iterator<PhyloTreeEdge,_PhyloTreeEdge_&,_PhyloTreeEdge_*>::operator*(&local_370);
      Bipartition::addOne(in_stack_fffffffffffffaa0,(size_t)in_stack_fffffffffffffa98);
      std::_Deque_iterator<PhyloTreeEdge,_PhyloTreeEdge_&,_PhyloTreeEdge_*>::operator++
                (in_stack_fffffffffffffa90);
    }
    local_118 = local_1a0;
  }
  local_341 = 1;
  this_02 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::operator+((char *)in_stack_fffffffffffffad8._M_current,in_stack_fffffffffffffad0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90);
  std::out_of_range::out_of_range(this_02,local_320);
  local_341 = 0;
  __cxa_throw(this_02,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

PhyloTree::PhyloTree(string t, bool rooted) {
    // do bracket counting sanity check
    if (count(t.begin(), t.end(), '(') != count(t.begin(), t.end(), ')')) {
        throw invalid_argument("Bracket mismatch error in tree: " + t);
    }

    int leafNum = 0;
    deque<PhyloTreeEdge> q;
    string label, length;
    size_t i = 0;

    // remove anything before the first (
    t = t.substr(t.find_first_of('('));
    newick = t;

    // remove whitespace
    Tools::despace(t);
    setLeaf2NumMapFromNewick(t);
    //pull off ';' if at end
//    t = t.erase(t.find_last_of(";"));

    // pull off the first and last brackets (and a root length, between the last bracket and ;, if there is one.
    t = t.substr(t.find_first_of('(') + 1);
    t = t.erase(t.find_last_of(')'));

    std::unordered_map<bitset_t, size_t, BitsetHash> hashmap; // Maintain store of edges keyed by bitset, value is index of edges[index]
    try {
        size_t end_of_label, end_of_length, alt_end_of_label;
        leafEdgeLengths = vector<double>(leaf2NumMap.size());
        size_t lastLeaf = leaf2NumMap.size();
        while (i < t.size()) {
            switch (t.at(i)) {
                case '(': {
                    q.emplace_front(string(leaf2NumMap.size(), '0'));
                    i++;
                    break;
                }

                case ')': {
                    end_of_length = Tools::nextIndex(t, i + 2, ",)");
                    if (t[i + 1] == ':') {
                        length = Tools::substring(t, i + 2, end_of_length);
                    }
                    else {
                        length = LENGTH_DEFAULT;
                    }
                    q.front().setAttribute(stod(length));

                    if (!rooted) {
                        if (q.front().partition[0]) {
                            q.front().partition.flip();
                        }
                        if (hashmap.find(q.front().partition) == hashmap.end()) {  // never before seen edge
                            hashmap[q.front().partition] = edges.size();
                            edges.push_back(q.front());
                        }
                        else {
                            size_t index = hashmap[q.front().partition];
                            edges[index].setAttribute(q.front().length + edges[index].getLength());
                        }
                    }
                    else {
                        edges.push_back(q.front());
                    }
                    q.pop_front();
                    i = end_of_length;
                    break;
                }

                case ',': {
                    i++;
                    break;
                }

                    // this char is the beginning of a leaf name
                default: {
                    end_of_label = Tools::nextIndex(t, i, ":");

                    // check if 'correct' :-delimited length is missing
                    alt_end_of_label = Tools::nextIndex(t, i, " ,()");
                    if (alt_end_of_label < end_of_label) {
                        end_of_label = end_of_length = alt_end_of_label;
                        length = LENGTH_DEFAULT;
                    }
                    else {
                        end_of_length = Tools::nextIndex(t, end_of_label, " ,)");
                        length = Tools::substring(t, end_of_label + 1, end_of_length);
                    }
                    label = Tools::substring(t, i, end_of_label);
                    leafNum = lower_bound(leaf2NumMap.begin(), leaf2NumMap.end(), label) - leaf2NumMap.begin();
                    if (leafNum == leaf2NumMap.size()) throw out_of_range("Could not find label (" + label + ") in leaf2NumMap");
                    leafEdgeLengths[leafNum] = stod(length);

                    for (auto &e: q) {
                        e.addOne((size_t) leafNum);
                    }
                    i = end_of_length;
                }
            }
        }
    }
    catch (out_of_range &range_err) {
        throw range_err;
    }

//    if (!rooted) {
//        size_t lastLeaf = leaf2NumMap.size() - 1;
//        for (auto &e : edges) {
//            if (e.contains(lastLeaf)) {
//                e.complement(lastLeaf + 1);
//            }
//        }
//    }

    for (size_t k = 0; k < edges.size(); ++k) {
        edges[k].setOriginalEdge(make_shared<Bipartition>(edges[k].asSplit()));
        edges[k].setOriginalID((int) k);
    }
}